

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckObject(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  ctmbstr ptVar2;
  AttVal *pAVar3;
  Node *pNVar4;
  ctmbstr cp;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    pNVar4 = node->content;
    if (pNVar4 == (Node *)0x0) {
LAB_0015446e:
      prvTidyReportAccessError(doc,node,0x29e);
      return;
    }
    if (pNVar4->type != TextNode) {
      for (pAVar3 = pNVar4->attributes; pAVar3 != (AttVal *)0x0; pAVar3 = pAVar3->next) {
        if ((pAVar3->dict != (Attribute *)0x0) && (pAVar3->dict->id == TidyAttr_ALT)) {
          return;
        }
      }
    }
    BVar1 = prvTidynodeIsText(pNVar4);
    pNVar4 = node->content;
    if (BVar1 == no) {
      BVar1 = prvTidynodeIsText(pNVar4->content);
      if (BVar1 == no) goto LAB_0015446e;
      pNVar4 = node->content->content;
    }
    ptVar2 = textFromOneNode(doc,pNVar4);
    do {
      if (*ptVar2 == '\0') goto LAB_0015446e;
      BVar1 = prvTidyIsWhite((int)*ptVar2);
      ptVar2 = ptVar2 + 1;
    } while (BVar1 != no);
  }
  return;
}

Assistant:

static void CheckObject( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    if (Level1_Enabled( doc ))
    {
        if ( node->content != NULL)
        {
            if ( node->content->type != TextNode )
            {
                Node* tnode = node->content;
                AttVal* av;

                for ( av=tnode->attributes; av; av = av->next )
                {
                    if ( attrIsALT(av) )
                    {
                        HasAlt = yes;
                        break;
                    }
                }
            }

            /* Must have alternate text representation for that element */
            if ( !HasAlt )
            {
                ctmbstr word = NULL;

                if ( TY_(nodeIsText)(node->content) )
                    word = textFromOneNode( doc, node->content );

                if ( word == NULL &&
                     TY_(nodeIsText)(node->content->content) )
                {
                    word = textFromOneNode( doc, node->content->content );
                }
                    
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasAlt && !HasDescription )
        {
            TY_(ReportAccessError)( doc, node, OBJECT_MISSING_ALT );
        }
    }
}